

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void * read_file(char *fn,uint *_sz)

{
  int __fd;
  int iVar1;
  __off_t _Var2;
  ssize_t sVar3;
  int *in_RSI;
  char *in_RDI;
  int fd;
  int sz;
  char *data;
  void *local_20;
  void *local_8;
  
  local_20 = (void *)0x0;
  __fd = open(in_RDI,0);
  if (__fd < 0) {
    local_8 = (void *)0x0;
  }
  else {
    _Var2 = lseek(__fd,0,2);
    iVar1 = (int)_Var2;
    if ((((iVar1 < 0) || (_Var2 = lseek(__fd,0,0), _Var2 != 0)) ||
        (local_20 = malloc((long)(iVar1 + 2)), local_20 == (void *)0x0)) ||
       (sVar3 = read(__fd,local_20,(long)iVar1), sVar3 != iVar1)) {
      close(__fd);
      if (local_20 != (void *)0x0) {
        free(local_20);
      }
      local_8 = (void *)0x0;
    }
    else {
      close(__fd);
      *(undefined1 *)((long)local_20 + (long)iVar1) = 10;
      *(undefined1 *)((long)local_20 + (long)(iVar1 + 1)) = 0;
      local_8 = local_20;
      if (in_RSI != (int *)0x0) {
        *in_RSI = iVar1;
      }
    }
  }
  return local_8;
}

Assistant:

void *read_file(const char *fn, unsigned *_sz)
{
    char *data;
    int sz;
    int fd;

    data = 0;
    fd = open(fn, O_RDONLY);
    if(fd < 0) return 0;

    sz = lseek(fd, 0, SEEK_END);
    if(sz < 0) goto oops;

    if(lseek(fd, 0, SEEK_SET) != 0) goto oops;

    data = (char*) malloc(sz + 2);
    if(data == 0) goto oops;

    if(read(fd, data, sz) != sz) goto oops;
    close(fd);
    data[sz] = '\n';
    data[sz+1] = 0;
    if(_sz) *_sz = sz;
    return data;

oops:
    close(fd);
    if(data != 0) free(data);
    return 0;
}